

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall SSTable::~SSTable(SSTable *this)

{
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  SSTableIndex *pSVar1;
  pointer pSVar2;
  
  operator_delete(this->header,0x20);
  this_00 = this->data;
  if (this_00 != (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)0x0) {
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(this_00);
  }
  operator_delete(this_00,0x18);
  pSVar1 = this->index;
  if ((pSVar1 != (SSTableIndex *)0x0) &&
     (pSVar2 = (pSVar1->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
               _M_impl.super__Vector_impl_data._M_start, pSVar2 != (pointer)0x0)) {
    operator_delete(pSVar2,(long)(pSVar1->
                                 super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar2)
    ;
  }
  operator_delete(pSVar1,0x18);
  std::filesystem::__cxx11::path::~path(&this->file);
  return;
}

Assistant:

SSTable::~SSTable() {
    delete header;
    delete data;
    delete index;
}